

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_crl.cpp
# Opt level: O3

bool LoadCRLFromFile(char *szFile,CertificateList *crl)

{
  LoadResult LVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  LVar1 = LoadObjectFromFile<CertificateList>(szFile,crl);
  switch(LVar1) {
  case Success:
    return true;
  case FileOpenFail:
    pcVar4 = "Cannot open input file: ";
    lVar3 = 0x18;
    break;
  case ParseError:
    pcVar4 = "Malformed CRL - parsing error: ";
    lVar3 = 0x1f;
    break;
  case DecodeError:
    pcVar4 = "Malformed CRL: ";
    lVar3 = 0xf;
    break;
  default:
    goto switchD_0010cc68_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  if (szFile == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x154280);
  }
  else {
    sVar2 = strlen(szFile);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,szFile,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
switchD_0010cc68_default:
  return false;
}

Assistant:

bool LoadCRLFromFile(const char* szFile, CertificateList& crl)
{
    LoadResult result = LoadObjectFromFile(szFile, crl);

    switch (result)
    {
    case LoadResult::Success:
        return true;

    case LoadResult::DecodeError:
        std::cout << "Malformed CRL: " << szFile << std::endl;
        break;

    case LoadResult::ParseError:
        std::cout << "Malformed CRL - parsing error: " << szFile << std::endl;
        break;

    case LoadResult::FileOpenFail:
        std::cout << "Cannot open input file: " << szFile << std::endl;
        break;
    
    }

    return false;
}